

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::InternalSwap
          (TreeEnsembleParameters_TreeNode *this,TreeEnsembleParameters_TreeNode *other)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  uint64 uVar4;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->evaluationinfo_).super_RepeatedPtrFieldBase,
             &(other->evaluationinfo_).super_RepeatedPtrFieldBase);
  uVar4 = this->treeid_;
  this->treeid_ = other->treeid_;
  other->treeid_ = uVar4;
  uVar4 = this->nodeid_;
  this->nodeid_ = other->nodeid_;
  other->nodeid_ = uVar4;
  iVar3 = this->nodebehavior_;
  this->nodebehavior_ = other->nodebehavior_;
  other->nodebehavior_ = iVar3;
  bVar2 = this->missingvaluetrackstruechild_;
  this->missingvaluetrackstruechild_ = other->missingvaluetrackstruechild_;
  other->missingvaluetrackstruechild_ = bVar2;
  uVar4 = this->branchfeatureindex_;
  this->branchfeatureindex_ = other->branchfeatureindex_;
  other->branchfeatureindex_ = uVar4;
  dVar1 = this->branchfeaturevalue_;
  this->branchfeaturevalue_ = other->branchfeaturevalue_;
  other->branchfeaturevalue_ = dVar1;
  uVar4 = this->truechildnodeid_;
  this->truechildnodeid_ = other->truechildnodeid_;
  other->truechildnodeid_ = uVar4;
  uVar4 = this->falsechildnodeid_;
  this->falsechildnodeid_ = other->falsechildnodeid_;
  other->falsechildnodeid_ = uVar4;
  dVar1 = this->relativehitrate_;
  this->relativehitrate_ = other->relativehitrate_;
  other->relativehitrate_ = dVar1;
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode::InternalSwap(TreeEnsembleParameters_TreeNode* other) {
  evaluationinfo_.InternalSwap(&other->evaluationinfo_);
  std::swap(treeid_, other->treeid_);
  std::swap(nodeid_, other->nodeid_);
  std::swap(nodebehavior_, other->nodebehavior_);
  std::swap(missingvaluetrackstruechild_, other->missingvaluetrackstruechild_);
  std::swap(branchfeatureindex_, other->branchfeatureindex_);
  std::swap(branchfeaturevalue_, other->branchfeaturevalue_);
  std::swap(truechildnodeid_, other->truechildnodeid_);
  std::swap(falsechildnodeid_, other->falsechildnodeid_);
  std::swap(relativehitrate_, other->relativehitrate_);
  std::swap(_cached_size_, other->_cached_size_);
}